

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::IsGB(MI<8UL,_GF2::MOGrevlex<8UL>_> *this)

{
  undefined1 uVar1;
  bool bVar2;
  WW<8UL> *this_00;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  const_reverse_iterator iter1;
  size_t i;
  const_reverse_iterator iter;
  size_t trace;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  MOGrevlex<8UL> *in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff10;
  reference in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  MM<8UL> *in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *poly2;
  undefined7 in_stack_ffffffffffffff78;
  reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_> local_70;
  undefined4 local_64;
  ulong local_60;
  reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_> local_40;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight;
  MI<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  MP<8UL,_GF2::MOGrevlex<8UL>_>::MP(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  polyRight = (MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x0;
  std::__cxx11::
  list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
  rbegin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          *)in_stack_ffffffffffffff18);
  do {
    poly2 = (MP<8UL,_GF2::MOGrevlex<8UL>_> *)&stack0xffffffffffffffb8;
    std::__cxx11::
    list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
    rend((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          *)in_stack_ffffffffffffff18);
    uVar1 = std::operator!=((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                             *)in_stack_ffffffffffffff10,
                            (reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                             *)in_stack_ffffffffffffff08);
    if (!(bool)uVar1) {
      local_1 = true;
LAB_00190ed2:
      local_64 = 1;
      MP<8UL,_GF2::MOGrevlex<8UL>_>::~MP((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x190edf);
      return local_1;
    }
    for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
      std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
      operator->((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)in_stack_ffffffffffffff10);
      this_00 = &MP<8UL,_GF2::MOGrevlex<8UL>_>::LM(in_stack_ffffffffffffff10)->super_WW<8UL>;
      bVar2 = WW<8UL>::Test(this_00,local_60);
      if (bVar2) {
        std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
        operator*((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   *)in_stack_ffffffffffffff10);
        MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
                  (in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                   (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        Reduce(in_stack_ffffffffffffffd0,polyRight);
        bVar2 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator!=
                          ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                           CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                           SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
        if (bVar2) {
          local_1 = false;
          goto LAB_00190ed2;
        }
      }
    }
    std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
    reverse_iterator(&local_70,&local_40);
    std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
    operator++((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_> *)
               in_stack_ffffffffffffff10);
    while( true ) {
      std::__cxx11::
      list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::rend((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              *)in_stack_ffffffffffffff18);
      bVar2 = std::operator!=((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                               *)in_stack_ffffffffffffff08);
      if (!bVar2) break;
      std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
      operator->((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff28 = MP<8UL,_GF2::MOGrevlex<8UL>_>::LM(in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff30 =
           std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
           operator->((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                       *)in_stack_ffffffffffffff10);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::LM(in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff27 =
           MM<8UL>::IsRelPrime(in_stack_ffffffffffffff28,
                               (MM<8UL> *)
                               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if (!(bool)in_stack_ffffffffffffff27) {
        in_stack_ffffffffffffff18 =
             std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ::operator*((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          *)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff10 =
             std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ::operator*((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          *)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff08 =
             (MOGrevlex<8UL> *)
             MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
                       (in_RDI,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                               CONCAT17(uVar1,in_stack_ffffffffffffff78),poly2);
        Reduce(in_stack_ffffffffffffffd0,polyRight);
        bVar2 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator!=
                          ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                           CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                           SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
        if (bVar2) {
          local_1 = false;
          goto LAB_00190ed2;
        }
      }
      std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
      operator++((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)in_stack_ffffffffffffff10);
    }
    polyRight = (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                ((long)&(polyRight->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                        super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl.
                        _M_node.super__List_node_base._M_next + 1);
    Env::Trace("IsGB: %zu polys");
    std::reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>::
    operator++((reverse_iterator<std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_> *)
               in_stack_ffffffffffffff10);
  } while( true );
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}